

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  ostream *poVar2;
  char **param_1_local;
  int param_0_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Hello from the second CMake example!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Version = ");
  iVar1 = examples::getVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int, char**) {

    std::cout << "Hello from the second CMake example!" << std::endl;
    std::cout << "Version = " << examples::getVersion() << std::endl;

    return 0;
}